

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyline.cpp
# Opt level: O2

int __thiscall ON_Polyline::Clean(ON_Polyline *this,double tolerance)

{
  double *pdVar1;
  uint uVar2;
  ON_3dPoint *pOVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  int i;
  long lVar8;
  double dVar9;
  
  uVar2 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_count;
  uVar6 = uVar2;
  if (2 < (int)uVar2) {
    iVar5 = 0;
    lVar8 = 1;
    lVar7 = 0x18;
    while( true ) {
      lVar4 = (long)(int)(uVar6 - 1);
      if (lVar4 <= lVar8) break;
      pOVar3 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a;
      dVar9 = ON_3dPoint::DistanceTo(pOVar3 + iVar5,(ON_3dPoint *)((long)&pOVar3->x + lVar7));
      if (tolerance < dVar9) {
        iVar5 = iVar5 + 1;
        lVar4 = (long)iVar5;
        if (lVar4 < lVar8) {
          pOVar3 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a;
          pOVar3[lVar4].z = *(double *)((long)&pOVar3->z + lVar7);
          pdVar1 = (double *)((long)&pOVar3->x + lVar7);
          dVar9 = pdVar1[1];
          pOVar3[lVar4].x = *pdVar1;
          pOVar3[lVar4].y = dVar9;
        }
      }
      lVar8 = lVar8 + 1;
      uVar6 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_count;
      lVar7 = lVar7 + 0x18;
    }
    if ((int)uVar6 <= (int)(iVar5 + 2U)) goto LAB_0059aa92;
    pOVar3 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a;
    pOVar3[(long)iVar5 + 1].z = pOVar3[lVar4].z;
    dVar9 = pOVar3[lVar4].y;
    pOVar3[(long)iVar5 + 1].x = pOVar3[lVar4].x;
    pOVar3[(long)iVar5 + 1].y = dVar9;
    uVar6 = iVar5 + 2U;
    while( true ) {
      (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_count = uVar6;
LAB_0059aa92:
      if ((int)uVar6 < 3) break;
      pOVar3 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a;
      dVar9 = ON_3dPoint::DistanceTo(pOVar3 + ((ulong)uVar6 - 2),pOVar3 + ((ulong)uVar6 - 1));
      uVar6 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_count;
      if (tolerance < dVar9) break;
      pOVar3 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_a;
      pOVar3[(long)(int)uVar6 + -2].z = pOVar3[(long)(int)uVar6 + -1].z;
      dVar9 = pOVar3[(long)(int)uVar6 + -1].y;
      pOVar3[(long)(int)uVar6 + -2].x = pOVar3[(long)(int)uVar6 + -1].x;
      pOVar3[(long)(int)uVar6 + -2].y = dVar9;
      uVar6 = (this->super_ON_3dPointArray).super_ON_SimpleArray<ON_3dPoint>.m_count - 1;
    }
  }
  return uVar2 - uVar6;
}

Assistant:

int ON_Polyline::Clean( double tolerance )
{
  // 14 January 2005 Dale Lear
  //     Fixed this cleaner so that it did not modify
  //     the start and end point.
  int count0 = m_count;

  if ( m_count > 2 )
  {
    int i,j;
    j = 0;
    for ( i = 1; i < m_count-1; i++ )
    {
       if ( m_a[j].DistanceTo(m_a[i]) <= tolerance )
         continue;
       j++;
       if ( i > j )
         m_a[j] = m_a[i];
    }

    if ( m_count > j+2 )
    {
      m_a[j+1] = m_a[m_count-1];
      m_count = j+2;
    }

    while ( m_count > 2 && m_a[m_count-2].DistanceTo(m_a[m_count-1]) <= tolerance )
    {
      m_a[m_count-2] = m_a[m_count-1];
      m_count--;
    }
  }

  return count0-m_count;
}